

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorRepresentable
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  TextureFormat TVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  TextureChannelClass TVar5;
  tcu *ptVar6;
  ConstPixelBufferAccess *pCVar7;
  int i;
  long lVar8;
  tcu *ptVar9;
  ConstPixelBufferAccess *pCVar10;
  tcu *this;
  ConstPixelBufferAccess *pCVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar16 [16];
  GenericVec4 GVar17;
  BVec4 channelMask;
  Vec4 sRGB;
  Vector<float,_4> res;
  Vec4 linearized;
  PixelBufferAccess access;
  tcu local_bc [4];
  TextureFormat local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [24];
  int aiStack_90 [4];
  undefined1 local_80 [16];
  ArrayBuffer<unsigned_char,_4UL,_1UL> local_70;
  PixelBufferAccess local_60;
  undefined8 local_38;
  undefined8 uStack_30;
  
  GVar17 = mapToFormatColorUnits(texFormat,normalizedRange);
  tcu::getTextureFormatChannelMask(local_bc,texFormat);
  iVar4 = tcu::TextureFormat::getPixelSize(texFormat);
  de::ArrayBuffer<unsigned_char,_4UL,_1UL>::ArrayBuffer(&local_70,(long)iVar4);
  local_b8 = (TextureFormat)&DAT_100000001;
  uStack_b0._0_4_ = 1.4013e-45;
  tcu::PixelBufferAccess::PixelBufferAccess(&local_60,texFormat,(IVec3 *)&local_b8,local_70.m_ptr);
  bVar3 = tcu::isSRGB(*texFormat);
  if (bVar3) {
    tcu::linearToSRGB((tcu *)&local_b8,normalizedRange);
    auVar15._0_4_ = 0x7e - ((int)local_b8.order >> 0x17);
    auVar15._4_4_ = 0x7e - ((int)local_b8.type >> 0x17);
    auVar15._8_4_ = 0x7e - ((int)(float)uStack_b0 >> 0x17);
    auVar15._12_4_ = 0x7e - ((int)uStack_b0._4_4_ >> 0x17);
    auVar13._4_4_ = auVar15._12_4_;
    auVar13._0_4_ = auVar15._8_4_;
    auVar13._8_4_ = auVar15._8_4_;
    auVar13._12_4_ = auVar15._12_4_;
    auVar16 = pshuflw(in_XMM3,auVar13,0xfe);
    auVar12 = pshuflw(auVar13,auVar13,0x54);
    auVar13 = pshuflw(auVar12,auVar15,0xfe);
    auVar14 = pshuflw(auVar13,auVar15,0x54);
    auVar14._0_4_ = ((local_b8.order & 0x7fffff) * 0xff + 0x7f800000 >> auVar14._0_8_) + 0x800000;
    auVar14._4_4_ = ((local_b8.type & 0x7fffff) * 0xff + 0x7f800000 >> auVar13._0_8_) + 0x800000;
    auVar14._8_4_ =
         (((uint)(float)uStack_b0 & 0x7fffff) * 0xff + 0x7f800000 >> auVar12._0_8_) + 0x800000;
    auVar14._12_4_ =
         (((uint)uStack_b0._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> auVar16._0_8_) + 0x800000;
    auVar12 = _DAT_019ec5b0 ^ auVar15;
    auVar16._0_4_ = -(uint)(-0x7ffffff8 < auVar12._0_4_);
    auVar16._4_4_ = -(uint)(-0x7ffffff8 < auVar12._4_4_);
    auVar16._8_4_ = -(uint)(-0x7ffffff8 < auVar12._8_4_);
    auVar16._12_4_ = -(uint)(-0x7ffffff8 < auVar12._12_4_);
    auVar15 = ~auVar16 & auVar14 | auVar15 & auVar16;
    auVar12._0_4_ = (float)(auVar15._0_4_ >> 0x18);
    auVar12._4_4_ = (float)(auVar15._4_4_ >> 0x18);
    auVar12._8_4_ = (float)(auVar15._8_4_ >> 0x18);
    auVar12._12_4_ = (float)(auVar15._12_4_ >> 0x18);
    local_a8._0_16_ = divps(auVar12,_DAT_01a9ab80);
    this = (tcu *)local_80;
    tcu::sRGBToLinear(this,(Vec4 *)local_a8);
    ptVar6 = (tcu *)&local_38;
    local_38 = 0;
    uStack_30 = 0;
    local_a8._0_16_ = ZEXT816(0);
    lVar8 = 0;
    do {
      ptVar9 = this;
      if (local_bc[lVar8] == (tcu)0x0) {
        ptVar9 = ptVar6;
      }
      *(undefined4 *)(local_a8 + lVar8 * 4) = *(undefined4 *)ptVar9;
      lVar8 = lVar8 + 1;
      ptVar6 = ptVar6 + 4;
      this = this + 4;
    } while (lVar8 != 4);
    local_a8._16_8_ = local_a8._0_8_;
    aiStack_90._0_8_ = local_a8._8_8_;
  }
  else {
    TVar5 = tcu::getTextureChannelClass(texFormat->type);
    uVar2 = uStack_b0;
    TVar1 = local_b8;
    local_b8 = GVar17.v._0_8_;
    uStack_b0 = GVar17.v._8_8_;
    switch(TVar5) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      tcu::PixelBufferAccess::setPixel(&local_60,(Vec4 *)&local_b8,0,0,0);
      pCVar11 = (ConstPixelBufferAccess *)local_80;
      tcu::ConstPixelBufferAccess::getPixel(pCVar11,(int)&local_60,0,0);
      pCVar7 = (ConstPixelBufferAccess *)local_a8;
      local_b8.order = R;
      local_b8.type = SNORM_INT8;
      uStack_b0._0_4_ = 0.0;
      uStack_b0._4_4_ = 0.0;
      lVar8 = 0;
      do {
        pCVar10 = pCVar11;
        if (local_bc[lVar8] == (tcu)0x0) {
          pCVar10 = pCVar7;
        }
        (&local_b8.order)[lVar8] = (pCVar10->m_format).order;
        lVar8 = lVar8 + 1;
        pCVar7 = (ConstPixelBufferAccess *)&(pCVar7->m_format).type;
        pCVar11 = (ConstPixelBufferAccess *)&(pCVar11->m_format).type;
      } while (lVar8 != 4);
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      tcu::PixelBufferAccess::setPixel(&local_60,(IVec4 *)&local_b8,0,0,0);
      pCVar11 = (ConstPixelBufferAccess *)local_80;
      tcu::ConstPixelBufferAccess::getPixelInt(pCVar11,(int)&local_60,0,0);
      pCVar7 = (ConstPixelBufferAccess *)local_a8;
      local_b8.order = R;
      local_b8.type = SNORM_INT8;
      uStack_b0._0_4_ = 0.0;
      uStack_b0._4_4_ = 0.0;
      lVar8 = 0;
      do {
        pCVar10 = pCVar7;
        if (local_bc[lVar8] != (tcu)0x0) {
          pCVar10 = pCVar11;
        }
        (&local_b8.order)[lVar8] = (pCVar10->m_format).order;
        lVar8 = lVar8 + 1;
        pCVar7 = (ConstPixelBufferAccess *)&(pCVar7->m_format).type;
        pCVar11 = (ConstPixelBufferAccess *)&(pCVar11->m_format).type;
      } while (lVar8 != 4);
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      tcu::PixelBufferAccess::setPixel(&local_60,(IVec4 *)&local_b8,0,0,0);
      pCVar11 = (ConstPixelBufferAccess *)local_80;
      tcu::ConstPixelBufferAccess::getPixelInt(pCVar11,(int)&local_60,0,0);
      pCVar7 = (ConstPixelBufferAccess *)local_a8;
      local_b8.order = R;
      local_b8.type = SNORM_INT8;
      uStack_b0._0_4_ = 0.0;
      uStack_b0._4_4_ = 0.0;
      lVar8 = 0;
      do {
        pCVar10 = pCVar7;
        if (local_bc[lVar8] != (tcu)0x0) {
          pCVar10 = pCVar11;
        }
        (&local_b8.order)[lVar8] = (pCVar10->m_format).order;
        lVar8 = lVar8 + 1;
        pCVar7 = (ConstPixelBufferAccess *)&(pCVar7->m_format).type;
        pCVar11 = (ConstPixelBufferAccess *)&(pCVar11->m_format).type;
      } while (lVar8 != 4);
      break;
    default:
      local_a8._16_4_ = R;
      local_a8._20_4_ = SNORM_INT8;
      aiStack_90[0] = 0;
      aiStack_90[1] = 0;
      local_b8 = TVar1;
      uStack_b0 = uVar2;
      goto LAB_014e713d;
    }
    local_a8._0_16_ = ZEXT816(0);
    local_a8._16_8_ = local_b8;
    aiStack_90._0_8_ = uStack_b0;
  }
LAB_014e713d:
  de::detail::ArrayBuffer_AlignedFree(local_70.m_ptr);
  GVar17.v._8_4_ = aiStack_90[0];
  GVar17.v._12_4_ = aiStack_90[1];
  GVar17.v._0_8_ = local_a8._16_8_;
  return (GenericVec4)GVar17.v;
}

Assistant:

rr::GenericVec4 mapToFormatColorRepresentable (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	// make sure value is representable in the target format and clear channels
	// not present in the target format.

	const rr::GenericVec4		inFormatUnits	= mapToFormatColorUnits(texFormat, normalizedRange);
	const tcu::BVec4			channelMask		= tcu::getTextureFormatChannelMask(texFormat);
	de::ArrayBuffer<deUint8, 4>	buffer			(texFormat.getPixelSize());
	tcu::PixelBufferAccess		access			(texFormat, tcu::IVec3(1, 1, 1), buffer.getPtr());

	if (tcu::isSRGB(texFormat))
	{
		DE_ASSERT(texFormat.type == tcu::TextureFormat::UNORM_INT8);

		// make sure border color (in linear space) can be converted to 8-bit sRGB space without
		// significant loss.
		const tcu::Vec4		sRGB		= tcu::linearToSRGB(normalizedRange);
		const tcu::IVec4	sRGB8		= tcu::IVec4(tcu::floatToU8(sRGB[0]),
													 tcu::floatToU8(sRGB[1]),
													 tcu::floatToU8(sRGB[2]),
													 tcu::floatToU8(sRGB[3]));
		const tcu::Vec4		linearized	= tcu::sRGBToLinear(tcu::Vec4((float)sRGB8[0] / 255.0f,
																	  (float)sRGB8[1] / 255.0f,
																	  (float)sRGB8[2] / 255.0f,
																	  (float)sRGB8[3] / 255.0f));

		return rr::GenericVec4(tcu::select(linearized, tcu::Vec4(0.0f), channelMask));
	}

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		{
			access.setPixel(inFormatUnits.get<float>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixel(0, 0), tcu::Vec4(0.0f), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deInt32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelInt(0, 0), tcu::IVec4(0), channelMask));
		}
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
		{
			access.setPixel(inFormatUnits.get<deUint32>(), 0, 0);
			return rr::GenericVec4(tcu::select(access.getPixelUint(0, 0), tcu::UVec4(0u), channelMask));
		}
		default:
		{
			DE_ASSERT(false);
			return rr::GenericVec4();
		}
	}
}